

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RegexRuntime.cpp
# Opt level: O3

void __thiscall
UnifiedRegex::SwitchMixin<(unsigned_char)'\x04'>::AddCase
          (SwitchMixin<(unsigned_char)__x04_> *this,char16 c,Label targetLabel)

{
  code *pcVar1;
  bool bVar2;
  char16 cVar3;
  undefined4 *puVar4;
  ulong uVar5;
  SwitchCase *pSVar6;
  byte bVar7;
  ulong uVar8;
  byte bVar9;
  
  bVar9 = this->numCases;
  if (3 < bVar9) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar4 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexRuntime.cpp"
                       ,0x38c,"(numCases < MaxCases)","numCases < MaxCases");
    if (!bVar2) {
LAB_00eea1e3:
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar4 = 0;
    bVar9 = this->numCases;
  }
  if (bVar9 == 0) {
    uVar8 = 0;
    bVar9 = 0;
  }
  else {
    pSVar6 = this->cases;
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    uVar8 = 0;
    do {
      cVar3 = pSVar6->c;
      if (cVar3 == c) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        *puVar4 = 1;
        bVar2 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexRuntime.cpp"
                           ,0x390,"(cases[i].c != c)","cases[i].c != c");
        if (!bVar2) goto LAB_00eea1e3;
        *puVar4 = 0;
        cVar3 = pSVar6->c;
        bVar9 = this->numCases;
      }
      if ((ushort)c < (ushort)cVar3) break;
      uVar8 = uVar8 + 1;
      pSVar6 = pSVar6 + 1;
    } while (uVar8 < bVar9);
    if ((byte)uVar8 < bVar9) {
      uVar5 = (ulong)bVar9 + 0xffffffff;
      pSVar6 = this->cases + bVar9;
      bVar7 = bVar9;
      do {
        *(undefined2 *)((long)&pSVar6->targetLabel + 2) =
             *(undefined2 *)((long)&this->cases[uVar5 & 0xffffffff].targetLabel + 2);
        *(undefined4 *)pSVar6 = *(undefined4 *)(this->cases + (uVar5 & 0xffffffff));
        uVar5 = uVar5 - 1;
        pSVar6 = pSVar6 + -1;
        bVar7 = bVar7 - 1;
      } while ((byte)uVar8 < bVar7);
    }
  }
  this->cases[uVar8 & 0xff].c = c;
  this->cases[uVar8 & 0xff].targetLabel = targetLabel;
  this->numCases = bVar9 + 1;
  return;
}

Assistant:

void SwitchMixin<n>::AddCase(char16 c, Label targetLabel)
    {
        AnalysisAssert(numCases < MaxCases);
        uint8 i;
        for (i = 0; i < numCases; i++)
        {
            Assert(cases[i].c != c);
            if (cases[i].c > c)
            {
                break;
            }
        }
        __analysis_assume(numCases < MaxCases);
        for (uint8 j = numCases; j > i; j--)
        {
            cases[j] = cases[j - 1];
        }
        cases[i].c = c;
        cases[i].targetLabel = targetLabel;
        numCases++;
    }